

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FluxRegister.cpp
# Opt level: O1

ssize_t __thiscall amrex::FluxRegister::write(FluxRegister *this,int __fd,void *__buf,size_t __n)

{
  undefined8 in_RAX;
  ostream *poVar1;
  ssize_t sVar2;
  undefined4 *__n_00;
  undefined8 uStack_28;
  
  __n_00 = &ParallelDescriptor::ioProcessor;
  uStack_28 = in_RAX;
  if (*(int *)(ParallelContext::frames + 0xc) == 0) {
    poVar1 = amrex::operator<<((ostream *)__buf,&this->ratio);
    uStack_28._0_6_ = CONCAT15(10,(undefined5)uStack_28);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_28 + 5),1);
    poVar1 = (ostream *)std::ostream::operator<<(__buf,this->fine_level);
    uStack_28._0_7_ = CONCAT16(10,(undefined6)uStack_28);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_28 + 6),1);
    poVar1 = (ostream *)std::ostream::operator<<(__buf,this->ncomp);
    uStack_28 = CONCAT17(10,(undefined7)uStack_28);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_28 + 7),1);
  }
  sVar2 = BndryRegister::write(&this->super_BndryRegister,__fd,__buf,(size_t)__n_00);
  return sVar2;
}

Assistant:

void
FluxRegister::write (const std::string& name, std::ostream& os) const
{
    if (ParallelDescriptor::IOProcessor())
    {
        os << ratio      << '\n';
        os << fine_level << '\n';
        os << ncomp      << '\n';
    }

    const BndryRegister* br = this;

    br->write(name,os);
}